

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

bool deqp::gls::BuiltinPrecisionTests::
     ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
               (IVal *ival,Vector<float,_3> *value)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  ulong uVar4;
  double *pdVar5;
  bool bVar6;
  double dVar7;
  
  pdVar5 = &ival->m_data[0].m_hi;
  uVar4 = 0;
  bVar6 = false;
  do {
    fVar1 = value->m_data[uVar4];
    dVar7 = (double)fVar1;
    dVar2 = dVar7;
    if (NAN(fVar1)) {
      dVar2 = INFINITY;
      dVar7 = -INFINITY;
    }
    bVar3 = dVar2 < pdVar5[-1] || *pdVar5 < dVar7;
    if ((!NAN(fVar1)) || (bVar3)) {
      if (bVar3) {
        return bVar6;
      }
    }
    else if (((Interval *)(pdVar5 + -2))->m_hasNaN == false) {
      return bVar6;
    }
    bVar6 = 1 < uVar4;
    uVar4 = uVar4 + 1;
    pdVar5 = pdVar5 + 3;
  } while (uVar4 != 3);
  return bVar6;
}

Assistant:

static bool			doContains		(const IVal& ival, const T& value)
	{
		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			if (!contains(ival[ndx], value[ndx]))
				return false;

		return true;
	}